

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O0

void DoHorizontalFilter_C
               (uint8_t *in,int width,int height,int stride,int row,int num_rows,int inverse,
               uint8_t *out)

{
  int in_ECX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint8_t *in_stack_00000010;
  int last_row;
  size_t start_offset;
  uint8_t *preds;
  uint8_t *local_40;
  uint8_t *local_28;
  int local_18;
  uint8_t *local_8;
  
  local_8 = (uint8_t *)(in_R8D * in_ECX + in_RDI);
  in_stack_00000010 = (uint8_t *)((long)(in_R8D * in_ECX) + (long)in_stack_00000010);
  local_40 = local_8;
  if (in_stack_00000008 != 0) {
    local_40 = in_stack_00000010;
  }
  local_28 = local_40;
  local_18 = in_R8D;
  if (in_R8D == 0) {
    *in_stack_00000010 = *local_8;
    PredictLine_C(local_8 + 1,local_40,in_stack_00000010 + 1,in_ESI + -1,in_stack_00000008);
    local_18 = 1;
    local_28 = local_40 + in_ECX;
    local_8 = local_8 + in_ECX;
    in_stack_00000010 = in_stack_00000010 + in_ECX;
  }
  for (; local_18 < in_R8D + in_R9D; local_18 = local_18 + 1) {
    PredictLine_C(local_8,local_28 + -(long)in_ECX,in_stack_00000010,1,in_stack_00000008);
    PredictLine_C(local_8 + 1,local_28,in_stack_00000010 + 1,in_ESI + -1,in_stack_00000008);
    local_28 = local_28 + in_ECX;
    local_8 = local_8 + in_ECX;
    in_stack_00000010 = in_stack_00000010 + in_ECX;
  }
  return;
}

Assistant:

static WEBP_INLINE void DoHorizontalFilter_C(const uint8_t* in,
                                             int width, int height, int stride,
                                             int row, int num_rows,
                                             int inverse, uint8_t* out) {
  const uint8_t* preds;
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;
  preds = inverse ? out : in;

  if (row == 0) {
    // Leftmost pixel is the same as input for topmost scanline.
    out[0] = in[0];
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    row = 1;
    preds += stride;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    // Leftmost pixel is predicted from above.
    PredictLine_C(in, preds - stride, out, 1, inverse);
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    ++row;
    preds += stride;
    in += stride;
    out += stride;
  }
}